

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

void Am_Error(char *error_string)

{
  ostream *poVar1;
  char *error_string_local;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"** Amulet Error: ");
  poVar1 = std::operator<<(poVar1,error_string);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cerr,"**  Program aborted.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  abort();
}

Assistant:

void
Am_Error(const char *error_string)
{
  std::cerr << "** Amulet Error: " << error_string << std::endl;

#ifdef DEBUG
  if (Am_Debugger) {
    Am_Debugger();
  }
#endif

  std::cerr << "**  Program aborted." << std::endl;

#if defined(_WIN32)
  std::cerr << "(press return to exit)" << std::endl;
  getchar();
#endif

  abort();
}